

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

int libtorrent::search(span<const_char> src,span<const_char> target)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = target.m_ptr + target.m_len;
  pcVar2 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (target.m_ptr,pcVar3,src.m_ptr,src.m_ptr + src.m_len);
  iVar1 = -1;
  if (pcVar2 != pcVar3) {
    iVar1 = (int)pcVar2 - (int)target.m_ptr;
  }
  return iVar1;
}

Assistant:

int search(span<char const> src, span<char const> target)
	{
		TORRENT_ASSERT(!src.empty());
		TORRENT_ASSERT(!target.empty());
		TORRENT_ASSERT(target.size() >= src.size());
		TORRENT_ASSERT(target.size() < std::numeric_limits<int>::max());

		auto const it = std::search(target.begin(), target.end(), src.begin(), src.end());

		// no complete sync
		if (it == target.end()) return -1;
		return static_cast<int>(it - target.begin());
	}